

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t index,utf32_t x,
          size_t count)

{
  C *pCVar1;
  C *p;
  size_t sVar2;
  size_t patternLength;
  size_t length;
  C pattern [4];
  
  sVar2 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  if (count != 0) {
    pCVar1 = enc::Utf8Encoder::encode(pattern,x,0xfffd);
    patternLength = (long)pCVar1 - (long)pattern;
    length = patternLength * count;
    p = insertSpace(this,index,length);
    if (p == (C *)0x0) {
      sVar2 = 0xffffffffffffffff;
    }
    else {
      fillWithPattern(p,pattern,patternLength,count);
      sVar2 = sVar2 + length;
    }
  }
  return sVar2;
}

Assistant:

size_t
	insert(
		size_t index,
		utf32_t x,
		size_t count
	) {
		size_t oldLength = this->m_length;

		if (count == 0)
			return oldLength;

		C pattern[sizeof(utf32_t) / sizeof(C)];
		C* end = Encoding::Encoder::encode(pattern, x);
		size_t codePointLength = end - pattern;
		ASSERT(codePointLength <= countof(pattern));

		size_t insertLength = count * codePointLength;
		C* dst = insertSpace(index, count * codePointLength);
		if (!dst)
			return -1;

		fillWithPattern(dst, pattern, codePointLength, count);
		return oldLength + insertLength;
	}